

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall HWISim::PinMode(HWISim *this,Pin pin,PinIOMode mode)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  PinIOMode local_20;
  Pin local_1c;
  
  local_20 = mode;
  local_1c = pin;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PM (",4);
  pmVar1 = std::__detail::
           _Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&HWI::pinNames_abi_cxx11_,&local_1c);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar1->_M_dataplus)._M_p,pmVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") = ",4);
  pmVar3 = std::__detail::
           _Map_base<HWI::PinIOMode,_std::pair<const_HWI::PinIOMode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::PinIOMode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::PinIOMode>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<HWI::PinIOMode,_std::pair<const_HWI::PinIOMode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::PinIOMode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::PinIOMode>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&HWI::pinIOModeNames_abi_cxx11_,&local_20);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void PinMode( Pin pin, PinIOMode mode ) override
  {
    std::cout << "PM (" << HWI::pinNames.at(pin) << ") = " << HWI::pinIOModeNames.at(mode) << "\n";
  }